

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cc
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flow::lang::Expr_*>
* __thiscall
flow::lang::ParamList::at_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flow::lang::Expr_*>
           *__return_storage_ptr__,ParamList *this,size_t offset)

{
  bool bVar1;
  const_reference pvVar2;
  const_reference this_00;
  pointer local_60 [3];
  byte local_42;
  allocator<char> local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  size_type local_20;
  size_t offset_local;
  ParamList *this_local;
  
  local_20 = offset;
  offset_local = (size_t)this;
  this_local = (ParamList *)__return_storage_ptr__;
  bVar1 = isNamed(this);
  local_42 = 0;
  if (bVar1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->names_,local_20);
    std::__cxx11::string::string((string *)&local_40,(string *)pvVar2);
  }
  else {
    std::allocator<char>::allocator();
    local_42 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  }
  this_00 = std::
            vector<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
            ::operator[](&this->values_,local_20);
  local_60[0] = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::get
                          (this_00);
  std::make_pair<std::__cxx11::string_const,flow::lang::Expr*>
            (__return_storage_ptr__,&local_40,local_60);
  std::__cxx11::string::~string((string *)&local_40);
  if ((local_42 & 1) != 0) {
    std::allocator<char>::~allocator(&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, Expr*> ParamList::at(size_t offset) const {
  return std::make_pair(isNamed() ? names_[offset] : "", values_[offset].get());
}